

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTConstructCallAction_UnloadEventMemory
               (EventLogEntry *evt,UnlinkableSlabAllocator *alloc)

{
  JsRTConstructCallAction *pJVar1;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                     (evt);
  if (pJVar1->ArgArray != (TTDVar *)0x0) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,pJVar1->ArgArray);
  }
  if (pJVar1->ExecArgs != (Var *)0x0) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,pJVar1->ExecArgs);
    return;
  }
  return;
}

Assistant:

void JsRTConstructCallAction_UnloadEventMemory(EventLogEntry* evt, UnlinkableSlabAllocator& alloc)
        {
            JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            if(ccAction->ArgArray != nullptr)
            {
                alloc.UnlinkAllocation(ccAction->ArgArray);
            }

            if(ccAction->ExecArgs != nullptr)
            {
                alloc.UnlinkAllocation(ccAction->ExecArgs);
            }
        }